

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjectFile.cpp
# Opt level: O3

bool __thiscall ObjectFile::deleteAttribute(ObjectFile *this,CK_ATTRIBUTE_TYPE type)

{
  map<unsigned_long,_OSAttribute_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_OSAttribute_*>_>_>
  *this_00;
  mapped_type *ppOVar1;
  undefined1 uVar2;
  pair<std::_Rb_tree_iterator<std::pair<const_unsigned_long,_OSAttribute_*>_>,_std::_Rb_tree_iterator<std::pair<const_unsigned_long,_OSAttribute_*>_>_>
  pVar3;
  MutexLocker lock;
  CK_ATTRIBUTE_TYPE local_28;
  MutexLocker local_20;
  
  local_28 = type;
  if (this->valid == false) {
    uVar2 = 0;
    softHSMLog(7,"deleteAttribute",
               "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/object_store/ObjectFile.cpp"
               ,0xf1,"Cannot update invalid object %s",(this->path)._M_dataplus._M_p);
  }
  else {
    MutexLocker::MutexLocker(&local_20,this->objectMutex);
    this_00 = &this->attributes;
    ppOVar1 = std::
              map<unsigned_long,_OSAttribute_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_OSAttribute_*>_>_>
              ::operator[](this_00,&local_28);
    if (*ppOVar1 == (mapped_type)0x0) {
      softHSMLog(7,"deleteAttribute",
                 "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/object_store/ObjectFile.cpp"
                 ,0xfb,"Cannot delete attribute that doesn\'t exist in object %s",
                 (this->path)._M_dataplus._M_p);
      MutexLocker::~MutexLocker(&local_20);
      uVar2 = 0;
    }
    else {
      ppOVar1 = std::
                map<unsigned_long,_OSAttribute_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_OSAttribute_*>_>_>
                ::operator[](this_00,&local_28);
      if (*ppOVar1 != (mapped_type)0x0) {
        (*(*ppOVar1)->_vptr_OSAttribute[1])();
      }
      pVar3 = std::
              _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_OSAttribute_*>,_std::_Select1st<std::pair<const_unsigned_long,_OSAttribute_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_OSAttribute_*>_>_>
              ::equal_range(&this_00->_M_t,&local_28);
      std::
      _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_OSAttribute_*>,_std::_Select1st<std::pair<const_unsigned_long,_OSAttribute_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_OSAttribute_*>_>_>
      ::_M_erase_aux(&this_00->_M_t,(_Base_ptr)pVar3.first._M_node,(_Base_ptr)pVar3.second._M_node);
      MutexLocker::~MutexLocker(&local_20);
      store(this,false);
      uVar2 = this->valid;
    }
  }
  return (bool)uVar2;
}

Assistant:

bool ObjectFile::deleteAttribute(CK_ATTRIBUTE_TYPE type)
{
	if (!valid)
	{
		DEBUG_MSG("Cannot update invalid object %s", path.c_str());

		return false;
	}

	{
		MutexLocker lock(objectMutex);

		if (attributes[type] == NULL)
		{
			DEBUG_MSG("Cannot delete attribute that doesn't exist in object %s", path.c_str());

			return false;
		}

		delete attributes[type];
		attributes.erase(type);
	}

	store();

	return valid;
}